

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes.c
# Opt level: O1

void nes_inesmir(int *ip)

{
  int iVar1;
  
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (0xf < value) {
      error("Mirror value out of range!");
      return;
    }
    ines_mapper_0 = ines_mapper_0 & 0xf0 | value;
    if (pass == 1) {
      println();
      return;
    }
  }
  return;
}

Assistant:

void
nes_inesmir(int *ip)
{
	if (!evaluate(ip, ';'))
		return;

    int svalue = (int)value;
	if ((svalue < 0) || (svalue > 15)) 
	{
		error("Mirror value out of range!");
	
		return;
	}
	
	ines_mapper[0] &= 0xF0;
	ines_mapper[0] |= (value  & 0x0F);

	if (pass == LAST_PASS) 
	{
		println();
	}
}